

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3GetInt32(char *zNum,int *pValue)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  long lVar5;
  byte *pbVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  
  cVar1 = *zNum;
  if (cVar1 == '-') {
    zNum = zNum + 1;
    lVar5 = -1;
  }
  else {
    if (cVar1 == '0') {
      if (((byte)(zNum[1] | 0x20U) == 0x78) && ((""[(byte)zNum[2]] & 8) != 0)) {
        pbVar6 = (byte *)(zNum + 1);
        do {
          pbVar4 = pbVar6 + 1;
          pbVar6 = pbVar6 + 1;
        } while (*pbVar4 == 0x30);
        lVar5 = 0;
        uVar7 = 0;
        pbVar4 = pbVar6;
        do {
          bVar2 = *pbVar4;
          if ((""[bVar2] & 8) == 0) goto LAB_0015cf6b;
          uVar7 = (uint)(((char)(bVar2 * '\x02') >> 7 & 9U) + bVar2 & 0xf) | uVar7 << 4;
          lVar5 = lVar5 + 1;
          pbVar4 = pbVar4 + 1;
        } while (lVar5 != 8);
        lVar5 = 8;
LAB_0015cf6b:
        if ((int)uVar7 < 0) {
          return 0;
        }
        if ((""[pbVar6[lVar5]] & 8) == 0) {
          *pValue = uVar7;
          return 1;
        }
        return 0;
      }
    }
    else if (cVar1 == '+') {
      zNum = zNum + 1;
    }
    lVar5 = 0;
  }
  if ((ulong)(byte)*zNum - 0x3a < 0xfffffffffffffff6) {
    return 0;
  }
  do {
    pbVar6 = (byte *)zNum;
    zNum = (char *)(pbVar6 + 1);
  } while (*pbVar6 == 0x30);
  lVar9 = 0;
  lVar8 = 0;
  do {
    if (9 < (byte)(pbVar6[lVar9] - 0x30)) goto LAB_0015cef1;
    lVar8 = (ulong)(pbVar6[lVar9] & 0xf) + lVar8 * 10;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0xb);
  lVar9 = 0xb;
LAB_0015cef1:
  if (10 < (uint)lVar9) {
    return 0;
  }
  if (lVar5 + lVar8 < 0x80000000) {
    iVar3 = -(int)lVar8;
    if (cVar1 != '-') {
      iVar3 = (int)lVar8;
    }
    *pValue = iVar3;
    return 1;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3GetInt32(const char *zNum, int *pValue){
  sqlite_int64 v = 0;
  int i, c;
  int neg = 0;
  if( zNum[0]=='-' ){
    neg = 1;
    zNum++;
  }else if( zNum[0]=='+' ){
    zNum++;
  }
#ifndef SQLITE_OMIT_HEX_INTEGER
  else if( zNum[0]=='0'
        && (zNum[1]=='x' || zNum[1]=='X')
        && sqlite3Isxdigit(zNum[2])
  ){
    u32 u = 0;
    zNum += 2;
    while( zNum[0]=='0' ) zNum++;
    for(i=0; i<8 && sqlite3Isxdigit(zNum[i]); i++){
      u = u*16 + sqlite3HexToInt(zNum[i]);
    }
    if( (u&0x80000000)==0 && sqlite3Isxdigit(zNum[i])==0 ){
      memcpy(pValue, &u, 4);
      return 1;
    }else{
      return 0;
    }
  }
#endif
  if( !sqlite3Isdigit(zNum[0]) ) return 0;
  while( zNum[0]=='0' ) zNum++;
  for(i=0; i<11 && (c = zNum[i] - '0')>=0 && c<=9; i++){
    v = v*10 + c;
  }

  /* The longest decimal representation of a 32 bit integer is 10 digits:
  **
  **             1234567890
  **     2^31 -> 2147483648
  */
  testcase( i==10 );
  if( i>10 ){
    return 0;
  }
  testcase( v-neg==2147483647 );
  if( v-neg>2147483647 ){
    return 0;
  }
  if( neg ){
    v = -v;
  }
  *pValue = (int)v;
  return 1;
}